

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extfilt.cc
# Opt level: O0

void __thiscall ExternalFilter::set_chip_model(ExternalFilter *this,chip_model model)

{
  chip_model model_local;
  ExternalFilter *this_local;
  
  if (model == MOS6581) {
    this->mixer_DC = 0x44601;
  }
  else {
    this->mixer_DC = 0;
  }
  return;
}

Assistant:

void ExternalFilter::set_chip_model(chip_model model)
{
  if (model == MOS6581) {
    // Maximum mixer DC output level; to be removed if the external
    // filter is turned off: ((wave DC + voice DC)*voices + mixer DC)*volume
    // See voice.cc and filter.cc for an explanation of the values.
    mixer_DC = ((((0x800 - 0x380) + 0x800)*0xff*3 - 0xfff*0xff/18) >> 7)*0x0f;
  }
  else {
    // No DC offsets in the MOS8580.
    mixer_DC = 0;
  }
}